

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O3

void __thiscall SymbolTable::cInsert(SymbolTable *this,Symbol *symbol,char *lexeme)

{
  Symbol **ppSVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  string *__range1;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (lexeme != (char *)0x0) {
    local_48 = local_38;
    sVar3 = strlen(lexeme);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,lexeme,lexeme + sVar3);
    if (local_40 == 0) {
      uVar7 = 0;
    }
    else {
      lVar5 = 1;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = (uVar7 + ((long)(char)local_48[lVar6] + -0x60) * lVar5) % 0x3b9aca09;
        lVar5 = (lVar5 * 0xad) % 0x3b9aca09;
        lVar6 = lVar6 + 1;
      } while (local_40 != lVar6);
      iVar2 = (int)(uVar7 * 0x446f8657 >> 0x20);
      uVar7 = (ulong)((int)uVar7 + (((uint)((int)uVar7 - iVar2) >> 1) + iVar2 >> 6) * -0x65);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    ppSVar1 = this->block;
    symbol->nextSymbol = ppSVar1[uVar7];
    ppSVar1[uVar7] = symbol;
    lVar5 = (long)this->headIndex;
    sVar3 = strlen(lexeme);
    uVar7 = (ulong)(uint)this->lexemeArraySize;
    if (sVar3 + lVar5 < uVar7) {
      pcVar4 = this->lexemeArray;
    }
    else {
      while( true ) {
        sVar3 = strlen(lexeme);
        if (sVar3 + lVar5 < uVar7) break;
        uVar8 = (int)uVar7 + 0x1000;
        uVar7 = (ulong)uVar8;
        this->lexemeArraySize = uVar8;
      }
      pcVar4 = (char *)realloc(this->lexemeArray,(long)(int)uVar7);
      this->lexemeArray = pcVar4;
      lVar5 = (long)this->headIndex;
    }
    strcpy(pcVar4 + lVar5,lexeme);
    iVar2 = this->headIndex;
    symbol->lexemeIndex = iVar2;
    sVar3 = strlen(lexeme);
    this->headIndex = (int)sVar3 + iVar2 + 1;
  }
  return;
}

Assistant:

void SymbolTable::cInsert(Symbol *symbol, const char *lexeme) {
    if (lexeme != NULL) {
        unsigned long index = cHash(lexeme);
        symbol->setNextSymbol(block[index]);
        block[index] = symbol;
        if (headIndex + strlen(lexeme) >= (unsigned) lexemeArraySize) {
            while (headIndex + strlen(lexeme) >= (unsigned) lexemeArraySize)
                lexemeArraySize += LEXEME_ARRAY_SIZE;
//            lexemeArraySize += (1 + strlen(lexeme)/LEXEME_ARRAY_SIZE)*LEXEME_ARRAY_SIZE;
            lexemeArray = (char *) realloc(lexemeArray, lexemeArraySize * sizeof(char));
        }
        strcpy(lexemeArray + headIndex, lexeme);
        symbol->setLexemeIndex(headIndex);
        headIndex += (int) strlen(lexeme) + 1;
    }
}